

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_flow_event_e fhndl_shortlifeerror(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  f->recv_result = msg->recv_result;
  gettimeofday((timeval *)&f->timeout,(__timezone_ptr_t)0x0);
  (f->timeout).tv_sec = (f->timeout).tv_sec + (ulong)msg->recv_lifetime;
  return fev_none;
}

Assistant:

static pcp_flow_event_e fhndl_shortlifeerror(pcp_flow_t *f,
                                             pcp_recv_msg_t *msg) {
    PCP_LOG(PCP_LOGLVL_DEBUG,
            "f->pcp_server_index=%d, f->state = %d, f->key_bucket=%d",
            f->pcp_server_indx, f->state, f->key_bucket);

    f->recv_result = msg->recv_result;

    gettimeofday(&f->timeout, NULL);
    f->timeout.tv_sec += msg->recv_lifetime;

    return fev_none;
}